

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

void visit_literal_expr(gvisitor_t *self,gnode_literal_expr_t *node)

{
  gnode_t *local_40;
  gnode_t *local_38;
  gnode_t *val;
  size_t _i;
  size_t _len;
  gnode_literal_expr_t *node_local;
  gvisitor_t *self_local;
  
  if (node->type == LITERAL_STRING_INTERPOLATED) {
    if ((node->value).str == (char *)0x0) {
      local_38 = (gnode_t *)0x0;
    }
    else {
      local_38 = (gnode_t *)((node->value).r)->n;
    }
    for (val = (gnode_t *)0x0; val < local_38; val = (gnode_t *)((long)&val->tag + 1)) {
      if (val < (gnode_t *)((node->value).r)->n) {
        local_40 = ((node->value).r)->p[(long)val];
      }
      else {
        local_40 = (gnode_t *)0x0;
      }
      gvisit(self,local_40);
    }
  }
  return;
}

Assistant:

static void visit_literal_expr (gvisitor_t *self, gnode_literal_expr_t *node) {
    /*

     NOTE:

     doubles and int64 should be added to the constant pool but I avoid
     adding them here so the optimizer has a way to perform better constant folding:
     http://en.wikipedia.org/wiki/Constant_folding
     http://www.compileroptimizations.com/category/constant_folding.htm

     */

    DEBUG_CODEGEN("visit_literal_expr");
    DECLARE_CODE();

    CODEGEN_COUNT_REGISTERS(n1);

    switch (node->type) {
        case LITERAL_STRING: {
            // LOADK temp, s
            uint16_t index = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_STRING(NULL, node->value.str, node->len));
			ircode_add_constant(code, index, LINE_NUMBER(node));
            DEBUG_CODEGEN("visit_literal_expr (string) %s", node->value.str);
        } break;

        case LITERAL_FLOAT:
            // LOADI temp, d
			ircode_add_double(code, node->value.d, LINE_NUMBER(node));
			DEBUG_CODEGEN("visit_literal_expr (float) %.5f", node->value.d);
            break;

        case LITERAL_INT:
            // LOADI temp, n
			ircode_add_int(code, node->value.n64, LINE_NUMBER(node));
            DEBUG_CODEGEN("visit_literal_expr (int) %lld", node->value.n64);
            break;

        case LITERAL_BOOL: {
            uint32_t value = (node->value.n64 == 0) ? CPOOL_VALUE_FALSE : CPOOL_VALUE_TRUE;
			ircode_add_constant(code, value, LINE_NUMBER(node));
            DEBUG_CODEGEN("visit_literal_expr (bool) %lld", node->value.n64);
        } break;

        case LITERAL_STRING_INTERPOLATED: {
            // codegen for string interpolation is like a list.join()

            gnode_list_expr_t *list = (gnode_list_expr_t *)gnode_list_expr_create(node->base.token, node->value.r, NULL, false, node->base.decl);
            visit((gnode_t *)list);

            // list
            uint32_t listreg = ircode_register_last(code);
            if (listreg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid string interpolated expression.");

            // LOADK
            uint16_t index = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, "join"));
			ircode_add_constant(code, index, LINE_NUMBER(node));
            uint32_t temp1 = ircode_register_last(code);
            DEBUG_ASSERT(temp1 != REGISTER_ERROR, "Unexpected register error.");

            // LOAD
			ircode_add(code, LOAD, temp1, listreg, temp1, LINE_NUMBER(node));

            // temp1+1 register used for parameter passing
            uint32_t temp2 = ircode_register_push_temp(code);

            // MOVE
			ircode_add(code, MOVE, temp2, listreg, 0, LINE_NUMBER(node));

            // CALL
			ircode_add(code, CALL, listreg, temp1, 1, LINE_NUMBER(node));

            // cleanup
            mem_free(list);
            uint32_t temp = ircode_register_pop(code);    // temp2
            DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");
            temp = ircode_register_pop(code);            // temp1
            DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");

            /*

             00012    LOADK 6 4
             00013    LOAD 6 4 6
             00014    MOVE 7 6
             00015    MOVE 8 4
             00016    CALL 6 7 1

             */

            break;
        }

        default: assert(0);
    }

    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, 1);
}